

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Type> *
wasm::WATParser::tabletype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  Type addressType;
  string_view expected;
  string_view expected_00;
  
  addressType.id = 3;
  expected._M_str = "i64";
  expected._M_len = 3;
  bVar1 = Lexer::takeKeyword(&ctx->in,expected);
  if (!bVar1) {
    expected_00._M_str = "i32";
    expected_00._M_len = 3;
    Lexer::takeKeyword(&ctx->in,expected_00);
    addressType.id = 2;
  }
  tabletypeContinued<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,addressType);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletype(Ctx& ctx) {
  Type addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }
  return tabletypeContinued(ctx, addressType);
}